

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeThread.c
# Opt level: O1

void * asyncWrite(void *parameters)

{
  long *plVar1;
  ulong *puVar2;
  size_t sVar3;
  long lVar4;
  _Bool _Var5;
  int iVar6;
  int_fast32_t write_fd;
  chunk *pcVar7;
  long lVar8;
  size_t data_size;
  ulong uVar9;
  
  write_fd = openForWrite(*(uint8_t **)((long)parameters + 0x30));
  if (write_fd < 0) {
    **(undefined4 **)((long)parameters + 0x18) = 0xfffffffd;
  }
  else {
    if (**(char **)((long)parameters + 8) == '\x01') {
      lVar8 = 0;
      uVar9 = 0;
      pcVar7 = (chunk *)0x0;
      do {
        if (**(int **)((long)parameters + 0x18) != 0) break;
        if (pcVar7 == (chunk *)0x0) {
          pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x20));
          pcVar7 = front(*(queue **)((long)parameters + 0x28));
          if ((pcVar7 == (chunk *)0x0) ||
             (pcVar7 = front(*(queue **)((long)parameters + 0x28)), pcVar7 == (chunk *)0x0)) {
            pcVar7 = (chunk *)0x0;
          }
          else {
            deque(*(queue **)((long)parameters + 0x28));
          }
          pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x20));
        }
        if (((pcVar7 != (chunk *)0x0) && (pcVar7->action == '\x05')) ||
           ((puVar2 = *(ulong **)((long)parameters + 0x38), puVar2 != (ulong *)0x0 &&
            ((**(char **)((long)parameters + 0x10) == '\x01' && (*puVar2 <= uVar9)))))) {
          destroyChunk(pcVar7);
          break;
        }
        if (pcVar7 == (chunk *)0x0) {
LAB_001071dd:
          pcVar7 = (chunk *)0x0;
        }
        else if (pcVar7->data != (uint64_t *)0x0) {
          data_size = pcVar7->data_size;
          if ((puVar2 != (ulong *)0x0) && (*puVar2 < data_size + uVar9)) {
            data_size = *puVar2 - uVar9;
          }
          sVar3 = pcVar7->data_size;
          _Var5 = writeBytes((uint8_t *)pcVar7->data,data_size,write_fd);
          if (_Var5) {
            lVar8 = lVar8 + sVar3;
            uVar9 = uVar9 + data_size;
            destroyChunk(pcVar7);
            goto LAB_001071dd;
          }
          **(undefined4 **)((long)parameters + 0x18) = 0xfffffffd;
          close((int)write_fd);
          break;
        }
        if (lVar8 == 0) {
LAB_00107207:
          lVar8 = 0;
        }
        else {
          iVar6 = pthread_mutex_trylock
                            (*(pthread_mutex_t **)(*(long *)((long)parameters + 0x40) + 8));
          if (iVar6 == 0) {
            lVar4 = *(long *)((long)parameters + 0x40);
            plVar1 = (long *)(lVar4 + 0x18);
            *plVar1 = *plVar1 + lVar8;
            pthread_mutex_unlock(*(pthread_mutex_t **)(lVar4 + 8));
            goto LAB_00107207;
          }
        }
      } while (**(char **)((long)parameters + 8) != '\0');
    }
    close((int)write_fd);
    if (**(int **)((long)parameters + 0x18) == 0) {
      rename(*(char **)((long)parameters + 0x30),
             *(char **)(*parameters + 0x10 +
                       (ulong)((*(byte *)(*parameters + 0x3c) & 0x20) == 0) * 8));
      **(undefined1 **)((long)parameters + 8) = 0;
    }
  }
  return (void *)0x0;
}

Assistant:

void* asyncWrite(void* parameters)
{
    pdebug("asyncWrite()\n");
    writeParams* params = parameters;
    int64_t write = openForWrite(params->temp_file_name);

    if(write < 0)
    {
        pdebug("Error opening file for write\n");
        *(params->error) = FILE_IO_FAIL;

        return NULL;
    }

    chunk* write_chunk = NULL;
    uint64_t bytes_written = 0;
    uint64_t bytes_to_write = 0;
    uint64_t write_progress = 0;

    while(*(params->running) && *(params->error) == 0)
    {
        if(write_chunk == NULL) //Get a chunk from the queue
        {
            pthread_mutex_lock(params->mutex);
            if(front(params->in) != NULL)
            {
                write_chunk = front(params->in);
                if(write_chunk != NULL) { deque(params->in); }
            }
            pthread_mutex_unlock(params->mutex);
        }

        //check for termination conditions
        if((write_chunk != NULL && write_chunk->action == DONE) || 
            ((params->file_size) != NULL &&
            *(params->valid) && 
            bytes_written >= *(params->file_size))) 
            //size constraints
        {
            pdebug("^^^^ AsyncWrite() terminating loop ^^^^\n");
            destroyChunk(write_chunk);
            break;
        }

        if(write_chunk != NULL && write_chunk->data != NULL)
        {
            //ensure we aren't writing padding or attack attempts
            if(params->file_size == NULL) { bytes_to_write = write_chunk->data_size; }
            else if(bytes_written + write_chunk->data_size > *(params->file_size))
            { bytes_to_write = *(params->file_size) - bytes_written; }
            else { bytes_to_write = write_chunk->data_size; }

            write_progress += write_chunk->data_size;

            if(!writeBytes((uint8_t*)write_chunk->data, bytes_to_write, write))
            {
                pdebug("^^^^ File I/O Error ^^^^\n");
                *(params->error) = FILE_IO_FAIL;
		        close(write);
                break;
            }
            
            ///write it to the file
            pdebug("^^^^ Writing a chunk of size %lu ^^^^\n", bytes_to_write);
            bytes_written += bytes_to_write;
            destroyChunk(write_chunk); //free the chunk
            write_chunk = NULL; 
        }
        
        if(write_progress > 0) //update the progress bar
	    {
	        if(pthread_mutex_trylock(params->progress->progress_mutex) == 0)
	        {
	            params->progress->progress += write_progress;
		        write_progress = 0;
		        pthread_mutex_unlock(params->progress->progress_mutex);
	        }
	    }	
    }
    
    close(write);

    if(*(params->error) == 0)
    {
        if(params->args->rename) //change the output file to what the user wanted
        { rename((char*)params->temp_file_name, (char*)params->args->rename_file); }
        else //rename the temp file to the original file name (replaces file)
        { rename((char*)params->temp_file_name, (char*)params->args->target_file); }

        //signal any other running threads to stop (in case they are stuck)
        *(params->running) = false;
    }
    
    pdebug("^^^^ writeThread Done ^^^^\n");
    //we are done
    return NULL;  
}